

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::writeConversion
          (CompilerMain *this,Reader reader,OutputStream *output)

{
  OutputStream *elementCount;
  CapTableReader *pCVar1;
  uint uVar2;
  SegmentReader *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint *puVar6;
  undefined8 *puVar7;
  size_t __n;
  uint uVar8;
  MessageSizeCounts MVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<capnp::word> uncheckedBuffer;
  ArrayPtr<capnp::word> uncheckedBuffer_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  TextCodec codec;
  MallocMessageBuilder message;
  PointerBuilder local_188;
  StructReader local_168;
  Builder local_130;
  undefined1 local_118 [248];
  
  if (JSON < this->convertTo) {
    kj::_::unreachable();
  }
  puVar6 = &switchD_00121492::switchdataD_0020f5d0;
  switch(this->convertTo) {
  case BINARY:
    uVar2 = this->segmentSize;
    uVar8 = 0x400;
    if (uVar2 != 0) {
      uVar8 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_118,uVar8,uVar2 == 0);
    MessageBuilder::getRootInternal(&local_130,(MessageBuilder *)local_118);
    local_168.dataSize = reader._reader.dataSize;
    local_168.pointerCount = reader._reader.pointerCount;
    local_168._38_2_ = reader._reader._38_2_;
    local_168.nestingLimit = reader._reader.nestingLimit;
    local_168._44_4_ = reader._reader._44_4_;
    local_168.data = reader._reader.data;
    local_168.pointers = reader._reader.pointers;
    local_168.segment = reader._reader.segment;
    local_168.capTable = reader._reader.capTable;
    local_188.pointer = local_130.builder.pointer;
    local_188.segment = local_130.builder.segment;
    local_188.capTable = local_130.builder.capTable;
    capnp::_::PointerBuilder::setStruct(&local_188,&local_168,false);
    AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_118);
    segments.ptr = (ArrayPtr<const_capnp::word> *)AVar10.size_;
    segments.size_ = (size_t)puVar6;
    writeMessage((capnp *)output,(OutputStream *)AVar10.ptr,segments);
    goto LAB_0012177a;
  case PACKED:
    uVar2 = this->segmentSize;
    uVar8 = 0x400;
    if (uVar2 != 0) {
      uVar8 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_118,uVar8,uVar2 == 0);
    MessageBuilder::getRootInternal(&local_130,(MessageBuilder *)local_118);
    local_168.dataSize = reader._reader.dataSize;
    local_168.pointerCount = reader._reader.pointerCount;
    local_168._38_2_ = reader._reader._38_2_;
    local_168.nestingLimit = reader._reader.nestingLimit;
    local_168._44_4_ = reader._reader._44_4_;
    local_168.data = reader._reader.data;
    local_168.pointers = reader._reader.pointers;
    local_168.segment = reader._reader.segment;
    local_168.capTable = reader._reader.capTable;
    local_188.pointer = local_130.builder.pointer;
    local_188.segment = local_130.builder.segment;
    local_188.capTable = local_130.builder.capTable;
    capnp::_::PointerBuilder::setStruct(&local_188,&local_168,false);
    AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_118);
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)AVar10.size_;
    segments_00.size_ = (size_t)puVar6;
    writePackedMessage((capnp *)output,(OutputStream *)AVar10.ptr,segments_00);
LAB_0012177a:
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_118);
    break;
  case FLAT:
    MVar9 = capnp::_::StructReader::totalSize(&reader._reader);
    elementCount = (OutputStream *)(MVar9.wordCount + 1);
    local_118._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    puVar7 = &kj::_::HeapArrayDisposer::instance;
    local_118._16_8_ = &kj::_::HeapArrayDisposer::instance;
    local_118._8_8_ = elementCount;
    memset((void *)local_118._0_8_,0,MVar9.wordCount * 8 + 8);
    uncheckedBuffer.size_ = (size_t)puVar7;
    uncheckedBuffer.ptr = (word *)local_118._8_8_;
    copyToUnchecked<capnp::AnyStruct::Reader&>
              ((capnp *)&reader._reader,(Reader *)local_118._0_8_,uncheckedBuffer);
    (*output->_vptr_OutputStream[2])(output,local_118._0_8_,local_118._8_8_ << 3);
    uVar5 = local_118._8_8_;
    uVar4 = local_118._0_8_;
    if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
      local_118._0_8_ = (_func_int **)0x0;
      local_118._8_8_ = (OutputStream *)0x0;
      (*(code *)(*(Arena **)local_118._16_8_)->_vptr_Arena)(local_118._16_8_,uVar4,8,uVar5,uVar5,0);
    }
    break;
  case FLAT_PACKED:
    MVar9 = capnp::_::StructReader::totalSize(&reader._reader);
    pCVar1 = (CapTableReader *)(MVar9.wordCount + 1);
    local_168.segment =
         (SegmentReader *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pCVar1,(size_t)pCVar1,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    puVar7 = &kj::_::HeapArrayDisposer::instance;
    local_168.data = &kj::_::HeapArrayDisposer::instance;
    local_168.capTable = pCVar1;
    memset(local_168.segment,0,MVar9.wordCount * 8 + 8);
    uncheckedBuffer_00.size_ = (size_t)puVar7;
    uncheckedBuffer_00.ptr = (word *)local_168.capTable;
    copyToUnchecked<capnp::AnyStruct::Reader&>
              ((capnp *)&reader._reader,(Reader *)local_168.segment,uncheckedBuffer_00);
    __n = 0;
    kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_118,output,(ArrayPtr<unsigned_char>)ZEXT816(0));
    capnp::_::PackedOutputStream::PackedOutputStream
              ((PackedOutputStream *)&local_188,(BufferedOutputStream *)local_118);
    capnp::_::PackedOutputStream::write
              ((PackedOutputStream *)&local_188,(int)local_168.segment,
               (void *)((long)local_168.capTable << 3),__n);
    capnp::_::PackedOutputStream::~PackedOutputStream((PackedOutputStream *)&local_188);
    kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_118);
    pCVar1 = local_168.capTable;
    pSVar3 = local_168.segment;
    if (local_168.segment != (SegmentReader *)0x0) {
      local_168.segment = (SegmentReader *)0x0;
      local_168.capTable = (CapTableReader *)0x0;
      (*(code *)**local_168.data)(local_168.data,pSVar3,8,pCVar1,pCVar1,0);
    }
    break;
  case CANONICAL:
    capnp::_::StructReader::canonicalize((Array<capnp::word> *)local_118,&reader._reader);
    (*output->_vptr_OutputStream[2])(output,local_118._0_8_,local_118._8_8_ << 3);
    uVar5 = local_118._8_8_;
    uVar4 = local_118._0_8_;
    if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
      local_118._0_8_ = (_func_int **)0x0;
      local_118._8_8_ = (OutputStream *)0x0;
      (*(code *)(*(Arena **)local_118._16_8_)->_vptr_Arena)(local_118._16_8_,uVar4,8,uVar5,uVar5,0);
    }
    break;
  case TEXT:
    TextCodec::TextCodec((TextCodec *)&local_188);
    TextCodec::setPrettyPrint((TextCodec *)&local_188,this->pretty);
    local_118._8_8_ = (this->rootType).super_Schema.raw;
    local_118._48_4_ = reader._reader.dataSize;
    local_118._52_2_ = reader._reader.pointerCount;
    local_118._54_2_ = reader._reader._38_2_;
    local_118._56_8_ = reader._reader._40_8_;
    local_118._32_8_ = reader._reader.data;
    local_118._40_8_ = reader._reader.pointers;
    local_118._16_8_ = reader._reader.segment;
    local_118._24_8_ = reader._reader.capTable;
    local_118._0_4_ = 10;
    TextCodec::encode((String *)&local_168,(TextCodec *)&local_188,(Reader *)local_118);
    DynamicValue::Reader::~Reader((Reader *)local_118);
    local_118._8_8_ = (OutputStream *)0x0;
    if (local_168.capTable != (CapTableReader *)0x0) {
      local_118._8_8_ = (OutputStream *)((long)&local_168.capTable[-1]._vptr_CapTableReader + 7);
    }
    local_118._16_8_ = &kj::_::ByteLiteral<2ul>;
    local_118._24_8_ = (SegmentReader *)0x1;
    (*output->_vptr_OutputStream[3])(output,local_118,2);
    pCVar1 = local_168.capTable;
    pSVar3 = local_168.segment;
    if (local_168.segment != (SegmentReader *)0x0) {
      local_168.segment = (SegmentReader *)0x0;
      local_168.capTable = (CapTableReader *)0x0;
      (*(code *)**local_168.data)(local_168.data,pSVar3,1,pCVar1,pCVar1,0);
    }
    TextCodec::~TextCodec((TextCodec *)&local_188);
    break;
  case JSON:
    JsonCodec::JsonCodec((JsonCodec *)&local_188);
    JsonCodec::setPrettyPrint((JsonCodec *)&local_188,this->pretty);
    JsonCodec::handleByAnnotation((JsonCodec *)&local_188,(this->rootType).super_Schema.raw);
    local_118._0_8_ = (this->rootType).super_Schema.raw;
    local_118._40_4_ = reader._reader.dataSize;
    local_118._44_2_ = reader._reader.pointerCount;
    local_118._46_2_ = reader._reader._38_2_;
    local_118._48_8_ = reader._reader._40_8_;
    local_118._24_8_ = reader._reader.data;
    local_118._32_8_ = reader._reader.pointers;
    local_118._8_8_ = reader._reader.segment;
    local_118._16_8_ = reader._reader.capTable;
    JsonCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)&local_168,(JsonCodec *)&local_188,(Reader *)local_118);
    local_118._8_8_ = (OutputStream *)0x0;
    if (local_168.capTable != (CapTableReader *)0x0) {
      local_118._8_8_ = (OutputStream *)((long)&local_168.capTable[-1]._vptr_CapTableReader + 7);
    }
    local_118._16_8_ = &kj::_::ByteLiteral<2ul>;
    local_118._24_8_ = (SegmentReader *)0x1;
    (*output->_vptr_OutputStream[3])(output,local_118,2);
    pCVar1 = local_168.capTable;
    pSVar3 = local_168.segment;
    if (local_168.segment != (SegmentReader *)0x0) {
      local_168.segment = (SegmentReader *)0x0;
      local_168.capTable = (CapTableReader *)0x0;
      (*(code *)**local_168.data)(local_168.data,pSVar3,1,pCVar1,pCVar1,0);
    }
    JsonCodec::~JsonCodec((JsonCodec *)&local_188);
  }
  return;
}

Assistant:

void writeConversion(AnyStruct::Reader reader, kj::OutputStream& output) {
    switch (convertTo) {
      case Format::BINARY: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writeMessage(output, message);
        return;
      }
      case Format::PACKED: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writePackedMessage(output, message);
        return;
      }
      case Format::FLAT: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        output.write(words.asBytes());
        return;
      }
      case Format::FLAT_PACKED: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        kj::BufferedOutputStreamWrapper buffered(output);
        capnp::_::PackedOutputStream packed(buffered);
        packed.write(words.asBytes());
        return;
      }
      case Format::CANONICAL: {
        auto words = reader.canonicalize();
        output.write(words.asBytes());
        return;
      }
      case Format::TEXT: {
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
      case Format::JSON: {
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
    }

    KJ_UNREACHABLE;
  }